

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O1

void av1_nonrd_use_partition
               (AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,MB_MODE_INFO **mib,
               TokenExtra **tp,int mi_row,int mi_col,BLOCK_SIZE bsize,PC_TREE *pc_tree)

{
  AV1_COMMON *cm;
  int (*paiVar1) [10];
  byte bVar2;
  TX_SIZE_SEARCH_METHOD TVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  MB_MODE_INFO **ppMVar7;
  MB_RD_RECORD *pMVar8;
  uint uVar9;
  byte bVar10;
  TX_MODE TVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  scale_factors *sf;
  PC_TREE *pPVar17;
  PICK_MODE_CONTEXT *pPVar18;
  long lVar19;
  uint uVar20;
  RefCntBuffer *pRVar21;
  long lVar22;
  BLOCK_SIZE bsize_00;
  YV12_BUFFER_CONFIG *src;
  uint mi_row_00;
  scale_factors *psVar23;
  int i_1;
  byte partition;
  int iVar24;
  TXFM_CONTEXT *pTVar25;
  BLOCK_SIZE BVar26;
  int i;
  long lVar27;
  buf_2d *pbVar28;
  ulong uVar29;
  bool bVar30;
  int *in_stack_fffffffffffffd58;
  long local_270;
  long local_228;
  RD_STATS dummy_cost;
  RD_STATS local_1d0;
  RD_STATS none_rdc;
  RD_SEARCH_MACROBLOCK_CONTEXT x_ctx;
  
  uVar29 = (ulong)bsize;
  bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar29];
  bVar10 = bVar2 >> 1;
  uVar9 = (uint)bVar10;
  if (uVar29 < 3) {
    partition = 0;
  }
  else {
    iVar12 = (cpi->common).mi_params.mi_rows;
    partition = 0xff;
    if ((mi_row < iVar12) && (iVar14 = (cpi->common).mi_params.mi_cols, mi_col < iVar14)) {
      iVar24 = (cpi->common).mi_params.mi_stride;
      ppMVar7 = (cpi->common).mi_params.mi_grid_base;
      lVar27 = (long)(iVar24 * mi_row + mi_col);
      BVar26 = ppMVar7[lVar27]->bsize;
      if (BVar26 == bsize) {
        partition = 0;
      }
      else {
        bVar4 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar29]
        ;
        bVar5 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar26]
        ;
        bVar6 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar26]
        ;
        if (((bsize == BLOCK_8X8) || (iVar12 <= (int)((uint)bVar10 + mi_row))) ||
           (iVar14 <= (int)((uint)(bVar4 >> 1) + mi_col))) {
          partition = *(byte *)((long)&get_partition_base_partitions +
                               (ulong)(bVar5 < bVar4) + (ulong)(bVar6 < bVar2) * 2);
        }
        else if (bVar6 == bVar2) {
          partition = 8;
          if ((uint)bVar5 << 2 != (uint)bVar4) {
            partition = (ppMVar7[lVar27 + (int)((uint)(bVar4 >> 1) * iVar24)]->bsize != BVar26) *
                        '\x04' + 1;
          }
        }
        else if (bVar5 == bVar4) {
          partition = 9;
          if ((uint)bVar6 << 2 != (uint)bVar2) {
            partition = (ppMVar7[lVar27 + (ulong)bVar10]->bsize != BVar26) * '\x05' + 2;
          }
        }
        else {
          partition = 3;
          if (((uint)bVar5 * 2 == (uint)bVar4 && (uint)bVar6 * 2 == (uint)bVar2) &&
             (partition = 4,
             "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
             [ppMVar7[lVar27 + (int)((uint)(bVar4 >> 1) * iVar24)]->bsize] != bVar2)) {
            partition = ("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                         [ppMVar7[lVar27 + (ulong)bVar10]->bsize] == bVar4) * '\x03' + 3;
          }
        }
      }
    }
  }
  BVar26 = BLOCK_INVALID;
  if (partition != 0xff) {
    uVar15 = uVar29;
    switch(uVar29) {
    case 0:
      break;
    case 1:
    case 2:
    case 4:
    case 5:
    case 7:
    case 8:
switchD_001e3104_caseD_1:
      uVar15 = 6;
      bVar30 = true;
      goto LAB_001e313c;
    case 3:
      uVar15 = 1;
      break;
    case 6:
      uVar15 = 2;
      break;
    case 9:
      uVar15 = 3;
      break;
    default:
      if (bsize == BLOCK_64X64) {
        uVar15 = 4;
      }
      else {
        if (bsize != BLOCK_128X128) goto switchD_001e3104_caseD_1;
        uVar15 = 5;
      }
    }
    bVar30 = false;
LAB_001e313c:
    if (!bVar30) {
      BVar26 = subsize_lookup[partition][uVar15];
    }
  }
  iVar12 = 0;
  if (BLOCK_8X4 < bsize) {
    uVar20 = ""[uVar29] - 1;
    iVar12 = (uint)(((uint)(int)(td->mb).e_mbd.above_partition_context[mi_col] >> (uVar20 & 0x1f) &
                    1) != 0) +
             ((uint)(int)(td->mb).e_mbd.left_partition_context[mi_row & 0x1f] >>
              ((byte)uVar20 & 0x1f) & 1) * 2 + (uint)""[uVar29] * 4 + -4;
  }
  dummy_cost.rate = 0x7fffffff;
  dummy_cost.zero_rate = 0;
  dummy_cost.dist = 0x7fffffffffffffff;
  dummy_cost.rdcost = 0x7fffffffffffffff;
  dummy_cost.sse = 0x7fffffffffffffff;
  dummy_cost.skip_txfm = '\0';
  if ((cpi->common).mi_params.mi_rows <= mi_row) {
    return;
  }
  if ((cpi->common).mi_params.mi_cols <= mi_col) {
    return;
  }
  lVar27 = (long)mi_col;
  (td->mb).e_mbd.above_txfm_context =
       (cpi->common).above_contexts.txfm[(tile_data->tile_info).tile_row] + lVar27;
  pTVar25 = (td->mb).e_mbd.left_txfm_context_buffer + (mi_row & 0x1f);
  (td->mb).e_mbd.left_txfm_context = pTVar25;
  bVar30 = (cpi->oxcf).tune_cfg.dist_metric == AOM_DIST_METRIC_QM_PSNR;
  (td->mb).txfm_search_params.use_qm_dist_metric = (uint)bVar30;
  (td->mb).txfm_search_params.use_default_intra_tx_type = 0;
  (td->mb).txfm_search_params.default_inter_tx_type_prob_thresh = 0x7fffffff;
  (td->mb).txfm_search_params.skip_txfm_level = (cpi->winner_mode_params).skip_txfm_level[0];
  (td->mb).txfm_search_params.predict_dc_level = (cpi->winner_mode_params).predict_dc_level[0];
  if (bVar30) {
    (td->mb).txfm_search_params.use_transform_domain_distortion = 1;
    uVar20 = 0;
  }
  else {
    (td->mb).txfm_search_params.use_transform_domain_distortion =
         (cpi->winner_mode_params).use_transform_domain_distortion[0];
    uVar20 = (cpi->winner_mode_params).tx_domain_dist_threshold[0];
  }
  (td->mb).txfm_search_params.tx_domain_dist_threshold = uVar20;
  (td->mb).txfm_search_params.coeff_opt_thresholds[0] =
       (cpi->winner_mode_params).coeff_opt_thresholds[0][0];
  (td->mb).txfm_search_params.coeff_opt_thresholds[1] =
       (cpi->winner_mode_params).coeff_opt_thresholds[0][1];
  TVar3 = (cpi->winner_mode_params).tx_size_search_methods[0];
  (td->mb).txfm_search_params.tx_size_search_method = TVar3;
  TVar11 = '\0';
  if ((cpi->common).features.coded_lossless == false) {
    TVar11 = '\x02' - (TVar3 == '\x02');
  }
  (td->mb).txfm_search_params.tx_mode_search_type = TVar11;
  (td->mb).txfm_search_params.prune_2d_txfm_mode =
       (uint)(cpi->sf).tx_sf.tx_type_search.prune_2d_txfm_mode;
  if (((td->mb).txfm_search_params.mode_eval_type != 0) &&
     (pMVar8 = (td->mb).txfm_search_info.mb_rd_record, pMVar8 != (MB_RD_RECORD *)0x0)) {
    pMVar8->index_start = 0;
    pMVar8->num = 0;
  }
  (td->mb).txfm_search_params.mode_eval_type = 0;
  (td->mb).reuse_inter_pred = (cpi->sf).rt_sf.reuse_inter_pred_nonrd != 0;
  cm = &cpi->common;
  bVar30 = true;
  if ((((((partition == 0) && ((cpi->sf).rt_sf.nonrd_check_partition_split == 1)) &&
        ((int)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [uVar29] + mi_row) < (cpi->common).mi_params.mi_rows)) &&
       ((BLOCK_8X8 < bsize && ((int)((uint)bVar2 + mi_col) < (cpi->common).mi_params.mi_cols)))) &&
      (((cm->current_frame).frame_type & 0xfd) != 0)) &&
     (kLowSad < (td->mb).content_state_sb.source_sad_nonrd)) {
    iVar14 = (cpi->common).remapped_ref_idx[0];
    lVar16 = (long)iVar14;
    psVar23 = (scale_factors *)0x0;
    if (lVar16 == -1) {
      pRVar21 = (RefCntBuffer *)0x0;
    }
    else {
      pRVar21 = (cpi->common).ref_frame_map[lVar16];
    }
    src = &pRVar21->buf;
    if (pRVar21 == (RefCntBuffer *)0x0) {
      src = (YV12_BUFFER_CONFIG *)0x0;
    }
    sf = (cpi->common).ref_scale_factors + lVar16;
    if (iVar14 == -1) {
      sf = psVar23;
    }
    bVar30 = ((cpi->common).seq_params)->monochrome == '\0';
    uVar20 = bVar30 + 1 + (uint)bVar30;
    av1_setup_src_planes(&td->mb,cpi->source,mi_row,mi_col,uVar20,bsize);
    av1_setup_pre_planes(&(td->mb).e_mbd,0,src,mi_row,mi_col,sf,uVar20);
    pbVar28 = &(td->mb).plane[0].src;
    lVar16 = 0;
    do {
      uVar13 = (*cpi->ppi->fn_ptr
                 [av1_ss_size_lookup[uVar29]
                  [*(int *)((long)(td->mb).e_mbd.plane[0].pre + lVar16 + -0x2c)]
                  [*(int *)((long)(td->mb).e_mbd.plane[0].pre + lVar16 + -0x28)]].sdf)
                         (pbVar28->buf,pbVar28->stride,
                          *(uint8_t **)((long)&(td->mb).e_mbd.plane[0].pre[0].buf + lVar16),
                          *(int *)((long)&(td->mb).e_mbd.plane[0].pre[0].stride + lVar16));
      uVar13 = (int)psVar23 + uVar13;
      psVar23 = (scale_factors *)(ulong)uVar13;
      lVar16 = lVar16 + 0xa30;
      pbVar28 = (buf_2d *)((long)(pbVar28 + 4) + 8);
    } while ((ulong)uVar20 * 0xa30 != lVar16);
    if ((int)uVar13 / (int)((uint)block_size_high[uVar29] * (uint)block_size_wide[uVar29]) < 0x19) {
      partition = 0;
      bVar30 = true;
    }
    else {
      none_rdc.rate = 0x7fffffff;
      none_rdc.zero_rate = 0;
      none_rdc.dist = 0x7fffffffffffffff;
      none_rdc.rdcost = 0x7fffffffffffffff;
      none_rdc.sse = 0x7fffffffffffffff;
      none_rdc.skip_txfm = '\0';
      av1_save_context(&td->mb,&x_ctx,mi_row,mi_col,bsize,3);
      (td->mb).e_mbd.above_txfm_context =
           (cpi->common).above_contexts.txfm[(tile_data->tile_info).tile_row] + lVar27;
      (td->mb).e_mbd.left_txfm_context = pTVar25;
      pc_tree->partitioning = '\0';
      av1_set_offsets(cpi,&tile_data->tile_info,&td->mb,mi_row,mi_col,bsize);
      if (pc_tree->none == (PICK_MODE_CONTEXT *)0x0) {
        pPVar18 = av1_alloc_pmc(cpi,bsize,&td->shared_coeff_buf);
        pc_tree->none = pPVar18;
        if (pPVar18 == (PICK_MODE_CONTEXT *)0x0) {
          aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate PICK_MODE_CONTEXT");
        }
      }
      else {
        av1_reset_pmc(pc_tree->none);
      }
      pick_sb_modes_nonrd(cpi,tile_data,&td->mb,mi_row,mi_col,&none_rdc,bsize,pc_tree->none);
      lVar16 = (long)iVar12;
      lVar22 = (long)none_rdc.rate + (long)(td->mb).mode_costs.partition_cost[lVar16][0];
      none_rdc.rate = (int)lVar22;
      none_rdc.rdcost = none_rdc.dist * 0x80 + ((td->mb).rdmult * lVar22 + 0x100 >> 9);
      av1_restore_context(&td->mb,&x_ctx,mi_row,mi_col,bsize,3);
      pc_tree->partitioning = '\x03';
      if (bsize < BLOCK_32X64) {
        (*(code *)(&DAT_004df420 + *(int *)(&DAT_004df420 + uVar29 * 4)))(mi_col,lVar16 * 5);
        return;
      }
      if (bsize == BLOCK_64X64) {
        lVar22 = 4;
        bVar30 = false;
      }
      else if (bsize == BLOCK_128X128) {
        lVar22 = 5;
        bVar30 = false;
      }
      else {
        lVar22 = 6;
        bVar30 = true;
      }
      paiVar1 = (td->mb).mode_costs.partition_cost + lVar16;
      bsize_00 = BLOCK_INVALID;
      if (!bVar30) {
        bsize_00 = subsize_lookup[3][lVar22];
      }
      uVar20 = (*paiVar1)[3];
      if (BLOCK_8X4 < bsize_00) {
        uVar20 = uVar20 + (*paiVar1)[0] * 4;
      }
      lVar16 = 0;
      do {
        if (pc_tree->split[lVar16] == (PC_TREE *)0x0) {
          pPVar17 = av1_alloc_pc_tree_node(bsize_00);
          pc_tree->split[lVar16] = pPVar17;
          if (pPVar17 == (PC_TREE *)0x0) {
            aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate PC_TREE");
          }
        }
        pc_tree->split[lVar16]->index = (int)lVar16;
        lVar16 = lVar16 + 1;
      } while (lVar16 != 4);
      uVar15 = 0;
      lVar16 = 0;
      local_228 = 0;
      do {
        local_1d0.rate = 0x7fffffff;
        local_1d0.zero_rate = 0;
        local_1d0.dist = 0x7fffffffffffffff;
        local_1d0.rdcost = 0x7fffffffffffffff;
        local_1d0.sse = 0x7fffffffffffffff;
        uVar13 = 0;
        if ((uVar15 & 1) != 0) {
          uVar13 = (uint)bVar10;
        }
        local_1d0.skip_txfm = '\0';
        mi_row_00 = ((uint)(uVar15 >> 1) & 0x7fffffff) * (uint)bVar10 + mi_row;
        iVar14 = 10;
        if (((int)mi_row_00 < (cpi->common).mi_params.mi_rows) &&
           (iVar24 = uVar13 + mi_col, iVar24 < (cpi->common).mi_params.mi_cols)) {
          (td->mb).e_mbd.above_txfm_context =
               (cpi->common).above_contexts.txfm[(tile_data->tile_info).tile_row] +
               (ulong)uVar13 + lVar27;
          (td->mb).e_mbd.left_txfm_context =
               (td->mb).e_mbd.left_txfm_context_buffer + (mi_row_00 & 0x1f);
          pPVar18 = pc_tree->split[uVar15]->none;
          if (pPVar18 == (PICK_MODE_CONTEXT *)0x0) {
            pPVar18 = av1_alloc_pmc(cpi,bsize_00,&td->shared_coeff_buf);
            pc_tree->split[uVar15]->none = pPVar18;
            if (pc_tree->split[uVar15]->none == (PICK_MODE_CONTEXT *)0x0) {
              aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate PICK_MODE_CONTEXT");
            }
          }
          else {
            av1_reset_pmc(pPVar18);
          }
          pPVar17 = pc_tree->split[uVar15];
          pPVar17->partitioning = '\0';
          pick_sb_modes_nonrd(cpi,tile_data,&td->mb,mi_row_00,iVar24,&local_1d0,bsize_00,
                              pPVar17->none);
          uVar13 = uVar20 + local_1d0.rate;
          uVar20 = 0x7fffffff;
          if ((uVar13 == 0x7fffffff) ||
             (lVar22 = lVar16 + local_1d0.dist, lVar22 == 0x7fffffffffffffff)) {
            local_228 = 0x7fffffffffffffff;
            lVar16 = 0x7fffffffffffffff;
          }
          else {
            bVar30 = local_228 != 0x7fffffffffffffff;
            local_228 = 0x7fffffffffffffff;
            lVar16 = 0x7fffffffffffffff;
            if (bVar30) {
              lVar19 = (long)(td->mb).rdmult;
              lVar16 = lVar22;
              uVar20 = uVar13;
              if ((int)uVar13 < 0) {
                local_228 = lVar22 * 0x80 - ((long)(lVar19 * (ulong)-uVar13 + 0x100) >> 9);
              }
              else {
                local_228 = lVar22 * 0x80 + ((long)(lVar19 * (ulong)uVar13 + 0x100) >> 9);
              }
            }
          }
          if (none_rdc.rdcost < local_228) {
            iVar14 = 8;
          }
          else {
            if (uVar15 != 3) {
              encode_b_nonrd(cpi,tile_data,td,tp,mi_row_00,iVar24,'\x01',bsize_00,'\0',
                             pc_tree->split[uVar15]->none,in_stack_fffffffffffffd58);
            }
            iVar14 = 0;
          }
        }
      } while (((iVar14 == 10) || (iVar14 == 0)) && (uVar15 = uVar15 + 1, uVar15 != 4));
      av1_restore_context(&td->mb,&x_ctx,mi_row,mi_col,bsize,3);
      partition = 0;
      bVar30 = true;
      if (lVar16 * 0x80 + ((long)(td->mb).rdmult * (long)(int)uVar20 + 0x100 >> 9) < none_rdc.rdcost
         ) {
        if (bsize < BLOCK_32X64) {
          (*(code *)(&DAT_004df448 + *(int *)(&DAT_004df448 + uVar29 * 4)))();
          return;
        }
        if (bsize == BLOCK_64X64) {
          local_270 = 4;
LAB_001e3e39:
          bVar30 = false;
        }
        else {
          if (bsize == BLOCK_128X128) {
            local_270 = 5;
            goto LAB_001e3e39;
          }
          local_270 = 6;
          bVar30 = true;
        }
        partition = 3;
        if (bVar30) {
          BVar26 = BLOCK_INVALID;
        }
        else {
          BVar26 = subsize_lookup[3][local_270];
        }
        bVar30 = false;
      }
    }
  }
  pc_tree->partitioning = partition;
  switch(partition) {
  case 0:
    if (pc_tree->none == (PICK_MODE_CONTEXT *)0x0) {
      pPVar18 = av1_alloc_pmc(cpi,bsize,&td->shared_coeff_buf);
      pc_tree->none = pPVar18;
      if (pPVar18 == (PICK_MODE_CONTEXT *)0x0) {
        aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate PICK_MODE_CONTEXT");
      }
    }
    else {
      av1_reset_pmc(pc_tree->none);
    }
    pick_sb_modes_nonrd(cpi,tile_data,&td->mb,mi_row,mi_col,&dummy_cost,bsize,pc_tree->none);
    pPVar18 = pc_tree->none;
    BVar26 = bsize;
    break;
  case 1:
    lVar27 = 0;
    do {
      if (pc_tree->horizontal[lVar27] == (PICK_MODE_CONTEXT *)0x0) {
        pPVar18 = av1_alloc_pmc(cpi,BVar26,&td->shared_coeff_buf);
        pc_tree->horizontal[lVar27] = pPVar18;
        if (pPVar18 == (PICK_MODE_CONTEXT *)0x0) {
          aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate PICK_MODE_CONTEXT");
        }
      }
      else {
        av1_reset_pmc(pc_tree->horizontal[lVar27]);
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 == 1);
    pick_sb_modes_nonrd(cpi,tile_data,&td->mb,mi_row,mi_col,&dummy_cost,BVar26,
                        pc_tree->horizontal[0]);
    encode_b_nonrd(cpi,tile_data,td,tp,mi_row,mi_col,'\0',BVar26,'\x01',pc_tree->horizontal[0],
                   in_stack_fffffffffffffd58);
    if (bsize < BLOCK_8X16) {
      return;
    }
    mi_row = uVar9 + mi_row;
    if ((cpi->common).mi_params.mi_rows <= mi_row) {
      return;
    }
    pick_sb_modes_nonrd(cpi,tile_data,&td->mb,mi_row,mi_col,&dummy_cost,BVar26,
                        pc_tree->horizontal[1]);
    pPVar18 = pc_tree->horizontal[1];
    partition = 1;
    break;
  case 2:
    lVar27 = 0;
    do {
      if (pc_tree->vertical[lVar27] == (PICK_MODE_CONTEXT *)0x0) {
        pPVar18 = av1_alloc_pmc(cpi,BVar26,&td->shared_coeff_buf);
        pc_tree->vertical[lVar27] = pPVar18;
        if (pPVar18 == (PICK_MODE_CONTEXT *)0x0) {
          aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate PICK_MODE_CONTEXT");
        }
      }
      else {
        av1_reset_pmc(pc_tree->vertical[lVar27]);
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 == 1);
    pick_sb_modes_nonrd(cpi,tile_data,&td->mb,mi_row,mi_col,&dummy_cost,BVar26,pc_tree->vertical[0])
    ;
    encode_b_nonrd(cpi,tile_data,td,tp,mi_row,mi_col,'\0',BVar26,'\x02',pc_tree->vertical[0],
                   in_stack_fffffffffffffd58);
    if (bsize < BLOCK_8X16) {
      return;
    }
    mi_col = uVar9 + mi_col;
    if ((cpi->common).mi_params.mi_cols <= mi_col) {
      return;
    }
    pick_sb_modes_nonrd(cpi,tile_data,&td->mb,mi_row,mi_col,&dummy_cost,BVar26,pc_tree->vertical[1])
    ;
    pPVar18 = pc_tree->vertical[1];
    partition = 2;
    break;
  case 3:
    lVar27 = 0;
    do {
      if (pc_tree->split[lVar27] == (PC_TREE *)0x0) {
        pPVar17 = av1_alloc_pc_tree_node(BVar26);
        pc_tree->split[lVar27] = pPVar17;
        if (pPVar17 == (PC_TREE *)0x0) {
          aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate PC_TREE");
        }
      }
      pc_tree->split[lVar27]->index = (int)lVar27;
      lVar27 = lVar27 + 1;
    } while (lVar27 != 4);
    if ((((cpi->sf).rt_sf.nonrd_check_partition_merge_mode == 0) ||
        (iVar14 = av1_is_leaf_split_partition(cm,mi_row,mi_col,bsize), iVar14 == 0)) ||
       ((BLOCK_64X64 < bsize || (((cm->current_frame).frame_type & 0xfd) == 0)))) {
      uVar29 = 0;
      do {
        uVar20 = 0;
        if ((uVar29 & 1) != 0) {
          uVar20 = uVar9;
        }
        iVar14 = ((uint)(uVar29 >> 1) & 0x7fffffff) * uVar9;
        iVar24 = iVar14 + mi_row;
        if ((iVar24 < (cpi->common).mi_params.mi_rows) &&
           ((int)(uVar20 + mi_col) < (cpi->common).mi_params.mi_cols)) {
          av1_nonrd_use_partition
                    (cpi,td,tile_data,
                     mib + (long)iVar14 * (long)(cpi->common).mi_params.mi_stride + (ulong)uVar20,tp
                     ,iVar24,uVar20 + mi_col,BVar26,pc_tree->split[uVar29]);
        }
        uVar29 = uVar29 + 1;
      } while (uVar29 != 4);
      if ((((bVar30) && (((cm->current_frame).frame_type & 0xfd) != 0)) &&
          (tile_data->allow_update_cdf == '\0')) &&
         ((((cpi->sf).rt_sf.partition_direct_merging != 0 &&
           ((td->mb).mode_costs.partition_cost[iVar12][0] <
            (td->mb).mode_costs.partition_cost[iVar12][3])) &&
          (((int)(mi_row + (uint)bVar2) <= (cpi->common).mi_params.mi_rows &&
           ((int)((uint)bVar2 + mi_col) <= (cpi->common).mi_params.mi_cols)))))) {
        direct_partition_merging(cpi,td,tile_data,mib,mi_row,mi_col,bsize);
      }
    }
    else {
      try_merge(cpi,td,tile_data,mib,tp,mi_row,mi_col,bsize,pc_tree,partition,BVar26,iVar12);
    }
  default:
    goto switchD_001e3e7e_default;
  }
  encode_b_nonrd(cpi,tile_data,td,tp,mi_row,mi_col,'\0',BVar26,partition,pPVar18,
                 in_stack_fffffffffffffd58);
switchD_001e3e7e_default:
  return;
}

Assistant:

void av1_nonrd_use_partition(AV1_COMP *cpi, ThreadData *td,
                             TileDataEnc *tile_data, MB_MODE_INFO **mib,
                             TokenExtra **tp, int mi_row, int mi_col,
                             BLOCK_SIZE bsize, PC_TREE *pc_tree) {
  AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  TileInfo *const tile_info = &tile_data->tile_info;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  const ModeCosts *mode_costs = &x->mode_costs;
  // Only square blocks from 8x8 to 128x128 are supported
  assert(bsize >= BLOCK_8X8 && bsize <= BLOCK_128X128);
  const int bs = mi_size_wide[bsize];
  const int hbs = bs / 2;
  PARTITION_TYPE partition = (bsize >= BLOCK_8X8)
                                 ? get_partition(cm, mi_row, mi_col, bsize)
                                 : PARTITION_NONE;
  BLOCK_SIZE subsize = get_partition_subsize(bsize, partition);
  assert(subsize <= BLOCK_LARGEST);
  const int pl = (bsize >= BLOCK_8X8)
                     ? partition_plane_context(xd, mi_row, mi_col, bsize)
                     : 0;

  RD_STATS dummy_cost;
  av1_invalid_rd_stats(&dummy_cost);

  if (mi_row >= mi_params->mi_rows || mi_col >= mi_params->mi_cols) return;

  assert(mi_size_wide[bsize] == mi_size_high[bsize]);

  xd->above_txfm_context =
      cm->above_contexts.txfm[tile_info->tile_row] + mi_col;
  xd->left_txfm_context =
      xd->left_txfm_context_buffer + (mi_row & MAX_MIB_MASK);

  // Initialize default mode evaluation params
  set_mode_eval_params(cpi, x, DEFAULT_EVAL);

  x->reuse_inter_pred = cpi->sf.rt_sf.reuse_inter_pred_nonrd;

  int change_none_to_split = 0;
  if (partition == PARTITION_NONE &&
      cpi->sf.rt_sf.nonrd_check_partition_split == 1) {
    change_none_to_split =
        try_split_partition(cpi, td, tile_data, tile_info, tp, x, xd, mi_params,
                            mi_row, mi_col, bsize, pl, pc_tree);
    if (change_none_to_split) {
      partition = PARTITION_SPLIT;
      subsize = get_partition_subsize(bsize, partition);
      assert(subsize <= BLOCK_LARGEST);
    }
  }

  pc_tree->partitioning = partition;

  switch (partition) {
    case PARTITION_NONE:
      if (!pc_tree->none) {
        pc_tree->none = av1_alloc_pmc(cpi, bsize, &td->shared_coeff_buf);
        if (!pc_tree->none)
          aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                             "Failed to allocate PICK_MODE_CONTEXT");
      } else {
        av1_reset_pmc(pc_tree->none);
      }
      pick_sb_modes_nonrd(cpi, tile_data, x, mi_row, mi_col, &dummy_cost, bsize,
                          pc_tree->none);
      encode_b_nonrd(cpi, tile_data, td, tp, mi_row, mi_col, 0, bsize,
                     partition, pc_tree->none, NULL);
      break;
    case PARTITION_VERT:
      for (int i = 0; i < SUB_PARTITIONS_RECT; ++i) {
        if (!pc_tree->vertical[i]) {
          pc_tree->vertical[i] =
              av1_alloc_pmc(cpi, subsize, &td->shared_coeff_buf);
          if (!pc_tree->vertical[i])
            aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                               "Failed to allocate PICK_MODE_CONTEXT");
        } else {
          av1_reset_pmc(pc_tree->vertical[i]);
        }
      }
      pick_sb_modes_nonrd(cpi, tile_data, x, mi_row, mi_col, &dummy_cost,
                          subsize, pc_tree->vertical[0]);
      encode_b_nonrd(cpi, tile_data, td, tp, mi_row, mi_col, 0, subsize,
                     PARTITION_VERT, pc_tree->vertical[0], NULL);
      if (mi_col + hbs < mi_params->mi_cols && bsize > BLOCK_8X8) {
        pick_sb_modes_nonrd(cpi, tile_data, x, mi_row, mi_col + hbs,
                            &dummy_cost, subsize, pc_tree->vertical[1]);
        encode_b_nonrd(cpi, tile_data, td, tp, mi_row, mi_col + hbs, 0, subsize,
                       PARTITION_VERT, pc_tree->vertical[1], NULL);
      }
      break;
    case PARTITION_HORZ:
      for (int i = 0; i < SUB_PARTITIONS_RECT; ++i) {
        if (!pc_tree->horizontal[i]) {
          pc_tree->horizontal[i] =
              av1_alloc_pmc(cpi, subsize, &td->shared_coeff_buf);
          if (!pc_tree->horizontal[i])
            aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                               "Failed to allocate PICK_MODE_CONTEXT");
        } else {
          av1_reset_pmc(pc_tree->horizontal[i]);
        }
      }
      pick_sb_modes_nonrd(cpi, tile_data, x, mi_row, mi_col, &dummy_cost,
                          subsize, pc_tree->horizontal[0]);
      encode_b_nonrd(cpi, tile_data, td, tp, mi_row, mi_col, 0, subsize,
                     PARTITION_HORZ, pc_tree->horizontal[0], NULL);

      if (mi_row + hbs < mi_params->mi_rows && bsize > BLOCK_8X8) {
        pick_sb_modes_nonrd(cpi, tile_data, x, mi_row + hbs, mi_col,
                            &dummy_cost, subsize, pc_tree->horizontal[1]);
        encode_b_nonrd(cpi, tile_data, td, tp, mi_row + hbs, mi_col, 0, subsize,
                       PARTITION_HORZ, pc_tree->horizontal[1], NULL);
      }
      break;
    case PARTITION_SPLIT:
      for (int i = 0; i < SUB_PARTITIONS_SPLIT; ++i) {
        if (!pc_tree->split[i]) {
          pc_tree->split[i] = av1_alloc_pc_tree_node(subsize);
          if (!pc_tree->split[i])
            aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                               "Failed to allocate PC_TREE");
        }
        pc_tree->split[i]->index = i;
      }
      if (cpi->sf.rt_sf.nonrd_check_partition_merge_mode &&
          av1_is_leaf_split_partition(cm, mi_row, mi_col, bsize) &&
          !frame_is_intra_only(cm) && bsize <= BLOCK_64X64) {
        try_merge(cpi, td, tile_data, mib, tp, mi_row, mi_col, bsize, pc_tree,
                  partition, subsize, pl);
      } else {
        for (int i = 0; i < SUB_PARTITIONS_SPLIT; i++) {
          int x_idx = (i & 1) * hbs;
          int y_idx = (i >> 1) * hbs;
          int jj = i >> 1, ii = i & 0x01;
          if ((mi_row + y_idx >= mi_params->mi_rows) ||
              (mi_col + x_idx >= mi_params->mi_cols))
            continue;
          av1_nonrd_use_partition(
              cpi, td, tile_data,
              mib + jj * hbs * mi_params->mi_stride + ii * hbs, tp,
              mi_row + y_idx, mi_col + x_idx, subsize, pc_tree->split[i]);
        }

        if (!change_none_to_split) {
          // Note: Palette, cfl are not supported.
          if (!frame_is_intra_only(cm) && !tile_data->allow_update_cdf &&
              cpi->sf.rt_sf.partition_direct_merging &&
              mode_costs->partition_cost[pl][PARTITION_NONE] <
                  mode_costs->partition_cost[pl][PARTITION_SPLIT] &&
              (mi_row + bs <= mi_params->mi_rows) &&
              (mi_col + bs <= mi_params->mi_cols)) {
            direct_partition_merging(cpi, td, tile_data, mib, mi_row, mi_col,
                                     bsize);
          }
        }
      }
      break;
    case PARTITION_VERT_A:
    case PARTITION_VERT_B:
    case PARTITION_HORZ_A:
    case PARTITION_HORZ_B:
    case PARTITION_HORZ_4:
    case PARTITION_VERT_4:
      assert(0 && "Cannot handle extended partition types");
    default: assert(0); break;
  }
}